

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O1

void jpeg_fdct_10x5(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  int *piVar1;
  int *piVar2;
  DCTELEM *pDVar3;
  int *piVar4;
  int *piVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  ulong uVar28;
  undefined1 auVar27 [16];
  int iVar56;
  ulong uVar29;
  undefined1 auVar30 [16];
  ulong uVar33;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  uint uVar57;
  uint uVar37;
  undefined1 auVar36 [16];
  uint uVar58;
  uint uVar39;
  undefined1 auVar38 [16];
  ulong uVar40;
  ulong uVar41;
  undefined1 auVar42 [16];
  uint uVar43;
  int iVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int iVar59;
  uint uVar47;
  ulong uVar48;
  int iVar50;
  int iVar52;
  undefined1 auVar49 [16];
  ulong uVar51;
  uint uVar53;
  int iVar55;
  undefined1 auVar54 [16];
  
  *(undefined1 (*) [16])(data + 0x3c) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(data + 0x38) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(data + 0x34) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(data + 0x30) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(data + 0x2c) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(data + 0x28) = (undefined1  [16])0x0;
  uVar25 = (ulong)start_col;
  lVar15 = 0;
  do {
    lVar16 = *(long *)((long)sample_data + lVar15);
    bVar6 = *(byte *)(lVar16 + 9 + uVar25);
    uVar33 = (ulong)((uint)*(byte *)(lVar16 + uVar25) + (uint)bVar6);
    bVar7 = *(byte *)(lVar16 + 1 + uVar25);
    bVar8 = *(byte *)(lVar16 + 8 + uVar25);
    uVar40 = (ulong)((uint)bVar7 + (uint)bVar8);
    bVar9 = *(byte *)(lVar16 + 3 + uVar25);
    bVar10 = *(byte *)(lVar16 + 6 + uVar25);
    uVar29 = (ulong)((uint)bVar9 + (uint)bVar10);
    bVar11 = *(byte *)(lVar16 + 4 + uVar25);
    bVar12 = *(byte *)(lVar16 + 5 + uVar25);
    uVar28 = (ulong)((uint)bVar11 + (uint)bVar12);
    lVar14 = uVar28 + uVar33;
    lVar20 = uVar33 - uVar28;
    lVar21 = uVar29 + uVar40;
    lVar22 = uVar40 - uVar29;
    lVar19 = (ulong)*(byte *)(lVar16 + uVar25) - (ulong)bVar6;
    bVar6 = *(byte *)(lVar16 + 2 + uVar25);
    bVar13 = *(byte *)(lVar16 + 7 + uVar25);
    lVar16 = (ulong)bVar7 - (ulong)bVar8;
    iVar17 = (uint)bVar6 + (uint)bVar13;
    lVar24 = (ulong)bVar6 - (ulong)bVar13;
    lVar18 = (ulong)bVar9 - (ulong)bVar10;
    lVar23 = (ulong)bVar11 - (ulong)bVar12;
    data[lVar15] = ((int)lVar14 + (int)lVar21 + iVar17) * 4 + -0x1400;
    data[lVar15 + 4] =
         (DCTELEM)(lVar21 * 0x7fffffff204 + (ulong)(uint)(iVar17 * 2) * -0x800000016a1 +
                   lVar14 * 0x249d + 0x400 >> 0xb);
    lVar14 = (lVar20 + lVar22) * 0x1a9a;
    data[lVar15 + 2] = (DCTELEM)(lVar20 * 0x1071 + lVar14 + 0x400U >> 0xb);
    data[lVar15 + 6] = (DCTELEM)(lVar14 + lVar22 * 0x7ffffffba5c + 0x400U >> 0xb);
    data[lVar15 + 5] = (((int)(lVar23 + lVar19) - (int)lVar24) - (int)(lVar16 - lVar18)) * 4;
    data[lVar15 + 1] =
         (DCTELEM)((ulong)(lVar23 * 0x714 + 0x400 +
                          lVar18 * 0x148c + lVar24 * 0x2000 + lVar16 * 0x2853 + lVar19 * 0x2cb3) >>
                  0xb);
    lVar21 = (lVar16 - lVar18) * 0x19e3 + lVar24 * -0x2000 + (lVar23 + lVar19) * 0x9e3;
    lVar14 = (lVar18 + lVar16) * -0x12cf + (lVar19 - lVar23) * 0x1e6f + 0x400;
    data[lVar15 + 3] = (DCTELEM)((ulong)(lVar14 + lVar21) >> 0xb);
    data[lVar15 + 7] = (DCTELEM)((ulong)(lVar14 - lVar21) >> 0xb);
    lVar15 = lVar15 + 8;
  } while (lVar15 != 0x28);
  lVar15 = -8;
  do {
    piVar4 = data + lVar15 + 0x28;
    piVar1 = data + lVar15 + 8;
    piVar2 = data + lVar15 + 0x10;
    auVar27 = *(undefined1 (*) [16])(data + lVar15 + 0x18);
    piVar5 = data + lVar15 + 0x20;
    iVar59 = *piVar4 + *piVar1;
    auVar49._4_4_ = piVar4[1] + piVar1[1];
    iVar17 = piVar4[2] + piVar1[2];
    iVar52 = piVar4[3] + piVar1[3];
    auVar26._4_4_ = iVar52;
    auVar26._0_4_ = iVar17;
    auVar26._8_4_ = iVar52;
    auVar26._12_4_ = -(uint)(iVar52 < 0);
    lVar14 = CONCAT44(-(uint)(iVar17 < 0),iVar17);
    auVar49._8_4_ = auVar49._4_4_;
    auVar49._12_4_ = -(uint)(auVar49._4_4_ < 0);
    lVar16 = CONCAT44(-(uint)(iVar59 < 0),iVar59);
    iVar56 = *piVar5 + *piVar2;
    auVar30._4_4_ = piVar5[1] + piVar2[1];
    iVar17 = piVar5[2] + piVar2[2];
    iVar52 = piVar5[3] + piVar2[3];
    auVar45._4_4_ = iVar52;
    auVar45._0_4_ = iVar17;
    auVar45._8_4_ = iVar52;
    auVar45._12_4_ = -(uint)(iVar52 < 0);
    lVar22 = CONCAT44(-(uint)(iVar17 < 0),iVar17);
    auVar30._8_4_ = auVar30._4_4_;
    auVar30._12_4_ = -(uint)(auVar30._4_4_ < 0);
    lVar21 = CONCAT44(-(uint)(iVar56 < 0),iVar56);
    auVar34._0_8_ = auVar27._8_8_;
    auVar54._0_8_ = auVar27._0_8_;
    auVar54._8_4_ = auVar27._4_4_;
    auVar54._12_4_ = -(uint)(auVar27._4_4_ < 0);
    lVar23 = CONCAT44(-(uint)(auVar27._0_4_ < 0),auVar27._0_4_);
    auVar34._8_4_ = auVar27._12_4_;
    auVar34._12_4_ = -(uint)(auVar27._12_4_ < 0);
    lVar18 = CONCAT44(-(uint)(auVar27._8_4_ < 0),auVar27._8_4_);
    lVar19 = lVar21 + lVar16;
    lVar20 = auVar30._8_8_ + auVar49._8_8_;
    uVar48 = lVar16 - lVar21;
    uVar51 = auVar49._8_8_ - auVar30._8_8_;
    lVar21 = lVar22 + lVar14;
    lVar16 = auVar45._8_8_ + auVar26._8_8_;
    uVar25 = lVar14 - lVar22;
    uVar28 = auVar26._8_8_ - auVar45._8_8_;
    uVar58 = *piVar1 - *piVar4;
    auVar38._4_4_ = piVar1[1] - piVar4[1];
    uVar39 = piVar1[2] - piVar4[2];
    iVar52 = piVar1[3] - piVar4[3];
    uVar57 = *piVar2 - *piVar5;
    auVar36._4_4_ = piVar2[1] - piVar5[1];
    uVar37 = piVar2[2] - piVar5[2];
    iVar17 = piVar2[3] - piVar5[3];
    uVar29 = lVar21 + lVar18;
    uVar33 = lVar16 + auVar34._8_8_;
    uVar40 = lVar19 + lVar23;
    uVar41 = lVar20 + auVar54._8_8_;
    pDVar3 = data + lVar15 + 8;
    *pDVar3 = (DCTELEM)((uVar40 & 0xffffffff) * 0x28f6 + 0x4000 +
                        ((uVar40 >> 0x20) * 0x28f6 << 0x20) >> 0xf);
    pDVar3[1] = (DCTELEM)((uVar41 & 0xffffffff) * 0x28f6 + 0x4000 +
                          ((uVar41 >> 0x20) * 0x28f6 << 0x20) >> 0xf);
    pDVar3[2] = (DCTELEM)((uVar29 & 0xffffffff) * 0x28f6 + 0x4000 +
                          ((uVar29 >> 0x20) * 0x28f6 << 0x20) >> 0xf);
    pDVar3[3] = (DCTELEM)((uVar33 & 0xffffffff) * 0x28f6 + 0x4000 +
                          ((uVar33 >> 0x20) * 0x28f6 << 0x20) >> 0xf);
    auVar31._4_4_ = iVar52;
    auVar31._0_4_ = uVar39;
    uVar29 = lVar21 + lVar18 * -4;
    uVar33 = lVar16 + auVar34._8_8_ * -4;
    uVar40 = lVar19 + lVar23 * -4;
    uVar41 = lVar20 + auVar54._8_8_ * -4;
    lVar23 = ((uVar40 >> 0x20) * 0xe7b << 0x20) + (uVar40 & 0xffffffff) * 0xe7b;
    lVar24 = ((uVar41 >> 0x20) * 0xe7b << 0x20) + (uVar41 & 0xffffffff) * 0xe7b;
    lVar21 = ((uVar29 >> 0x20) * 0xe7b << 0x20) + (uVar29 & 0xffffffff) * 0xe7b;
    lVar16 = ((uVar33 >> 0x20) * 0xe7b << 0x20) + (uVar33 & 0xffffffff) * 0xe7b;
    lVar20 = (uVar48 & 0xffffffff) * 0x2062 + 0x4000 + ((uVar48 >> 0x20) * 0x2062 << 0x20);
    lVar22 = (uVar51 & 0xffffffff) * 0x2062 + 0x4000 + ((uVar51 >> 0x20) * 0x2062 << 0x20);
    lVar18 = (uVar25 & 0xffffffff) * 0x2062 + 0x4000 + ((uVar25 >> 0x20) * 0x2062 << 0x20);
    lVar19 = (uVar28 & 0xffffffff) * 0x2062 + 0x4000 + ((uVar28 >> 0x20) * 0x2062 << 0x20);
    uVar53 = -(uint)((int)uVar39 < 0);
    iVar55 = -(uint)(iVar52 < 0);
    auVar31._8_4_ = iVar52;
    auVar31._12_4_ = iVar55;
    pDVar3 = data + lVar15 + 0x18;
    *pDVar3 = (DCTELEM)((ulong)(lVar20 + lVar23) >> 0xf);
    pDVar3[1] = (DCTELEM)((ulong)(lVar22 + lVar24) >> 0xf);
    pDVar3[2] = (DCTELEM)((ulong)(lVar18 + lVar21) >> 0xf);
    pDVar3[3] = (DCTELEM)((ulong)(lVar19 + lVar16) >> 0xf);
    uVar47 = -(uint)((int)uVar58 < 0);
    iVar50 = -(uint)(auVar38._4_4_ < 0);
    auVar38._8_4_ = auVar38._4_4_;
    auVar38._12_4_ = iVar50;
    auVar27._4_4_ = iVar17;
    auVar27._0_4_ = uVar37;
    auVar35._0_4_ = -(uint)((int)uVar37 < 0);
    auVar35._4_4_ = -(uint)(iVar17 < 0);
    auVar35._12_4_ = -(uint)(iVar17 < 0);
    auVar27._8_4_ = iVar17;
    auVar27._12_4_ = auVar35._4_4_;
    uVar25 = auVar27._8_8_;
    lVar14 = CONCAT44(auVar35._0_4_,uVar37);
    uVar43 = -(uint)((int)uVar57 < 0);
    iVar44 = -(uint)(auVar36._4_4_ < 0);
    auVar36._8_4_ = auVar36._4_4_;
    auVar36._12_4_ = iVar44;
    uVar33 = auVar36._8_8_;
    pDVar3 = data + lVar15 + 0x28;
    *pDVar3 = (DCTELEM)((ulong)(lVar20 - lVar23) >> 0xf);
    pDVar3[1] = (DCTELEM)((ulong)(lVar22 - lVar24) >> 0xf);
    pDVar3[2] = (DCTELEM)((ulong)(lVar18 - lVar21) >> 0xf);
    pDVar3[3] = (DCTELEM)((ulong)(lVar19 - lVar16) >> 0xf);
    uVar40 = CONCAT44(uVar43,uVar57) + CONCAT44(uVar47,uVar58);
    uVar41 = uVar33 + auVar38._8_8_;
    auVar42._4_4_ = iVar50;
    auVar42._0_4_ = uVar47;
    auVar42._8_4_ = iVar50;
    auVar42._12_4_ = -(uint)(iVar52 < 0);
    uVar28 = lVar14 + CONCAT44(uVar53,uVar39);
    uVar29 = uVar25 + auVar31._8_8_;
    auVar46._4_4_ = iVar55;
    auVar46._0_4_ = uVar53;
    auVar46._8_4_ = iVar55;
    auVar46._12_4_ = -(uint)(iVar52 < 0);
    lVar14 = (uVar40 & 0xffffffff) * 0x220c + 0x4000 + ((uVar40 >> 0x20) * 0x220c << 0x20);
    lVar21 = (uVar41 & 0xffffffff) * 0x220c + 0x4000 + ((uVar41 >> 0x20) * 0x220c << 0x20);
    lVar16 = (uVar28 & 0xffffffff) * 0x220c + 0x4000 + ((uVar28 >> 0x20) * 0x220c << 0x20);
    lVar18 = (uVar29 & 0xffffffff) * 0x220c + 0x4000 + ((uVar29 >> 0x20) * 0x220c << 0x20);
    pDVar3 = data + lVar15 + 0x10;
    *pDVar3 = (DCTELEM)(((ulong)uVar47 * 0x150b << 0x20) + (ulong)uVar58 * 0x150b + lVar14 >> 0xf);
    pDVar3[1] = (DCTELEM)(((auVar42._8_8_ & 0xffffffff) * 0x150b << 0x20) +
                          (auVar38._8_8_ & 0xffffffff) * 0x150b + lVar21 >> 0xf);
    pDVar3[2] = (DCTELEM)(((ulong)uVar53 * 0x150b << 0x20) + (ulong)uVar39 * 0x150b + lVar16 >> 0xf)
    ;
    pDVar3[3] = (DCTELEM)(((auVar46._8_8_ & 0xffffffff) * 0x150b << 0x20) +
                          (auVar31._8_8_ & 0xffffffff) * 0x150b + lVar18 >> 0xf);
    auVar32._4_4_ = iVar44;
    auVar32._0_4_ = uVar43;
    auVar32._8_4_ = iVar44;
    auVar32._12_4_ = -(uint)(iVar17 < 0);
    auVar35._8_4_ = auVar35._4_4_;
    pDVar3 = data + lVar15 + 0x20;
    *pDVar3 = (DCTELEM)(((ulong)uVar43 * 0xffffa6dc + (ulong)uVar57 * 0x7fff << 0x20) +
                        (ulong)uVar57 * 0xffffa6dc + lVar14 >> 0xf);
    pDVar3[1] = (DCTELEM)(((auVar32._8_8_ & 0xffffffff) * 0xffffa6dc +
                           (uVar33 & 0xffffffff) * 0x7fff << 0x20) +
                          (uVar33 & 0xffffffff) * 0xffffa6dc + lVar21 >> 0xf);
    pDVar3[2] = (DCTELEM)(((ulong)auVar35._0_4_ * 0xffffa6dc + (ulong)uVar37 * 0x7fff << 0x20) +
                          (ulong)uVar37 * 0xffffa6dc + lVar16 >> 0xf);
    pDVar3[3] = (DCTELEM)(((auVar35._8_8_ & 0xffffffff) * 0xffffa6dc +
                           (uVar25 & 0xffffffff) * 0x7fff << 0x20) +
                          (uVar25 & 0xffffffff) * 0xffffa6dc + lVar18 >> 0xf);
    lVar15 = lVar15 + 4;
  } while (lVar15 != 0);
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_10x5 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Zero 3 bottom rows of output coefficient block. */
  MEMZERO(&data[DCTSIZE*5], SIZEOF(DCTELEM) * DCTSIZE * 3);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* 10-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/20). */

  dataptr = data;
  for (ctr = 0; ctr < 5; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[9]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[8]);
    tmp12 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[7]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[6]);
    tmp4 = GETJSAMPLE(elemptr[4]) + GETJSAMPLE(elemptr[5]);

    tmp10 = tmp0 + tmp4;
    tmp13 = tmp0 - tmp4;
    tmp11 = tmp1 + tmp3;
    tmp14 = tmp1 - tmp3;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[9]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[8]);
    tmp2 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[7]);
    tmp3 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[6]);
    tmp4 = GETJSAMPLE(elemptr[4]) - GETJSAMPLE(elemptr[5]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp10 + tmp11 + tmp12 - 10 * CENTERJSAMPLE) << PASS1_BITS);
    tmp12 += tmp12;
    dataptr[4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp12, FIX(1.144122806)) - /* c4 */
	      MULTIPLY(tmp11 - tmp12, FIX(0.437016024)),  /* c8 */
	      CONST_BITS-PASS1_BITS);
    tmp10 = MULTIPLY(tmp13 + tmp14, FIX(0.831253876));    /* c6 */
    dataptr[2] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp13, FIX(0.513743148)),  /* c2-c6 */
	      CONST_BITS-PASS1_BITS);
    dataptr[6] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp14, FIX(2.176250899)),  /* c2+c6 */
	      CONST_BITS-PASS1_BITS);

    /* Odd part */

    tmp10 = tmp0 + tmp4;
    tmp11 = tmp1 - tmp3;
    dataptr[5] = (DCTELEM) ((tmp10 - tmp11 - tmp2) << PASS1_BITS);
    tmp2 <<= CONST_BITS;
    dataptr[1] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0, FIX(1.396802247)) +          /* c1 */
	      MULTIPLY(tmp1, FIX(1.260073511)) + tmp2 +   /* c3 */
	      MULTIPLY(tmp3, FIX(0.642039522)) +          /* c7 */
	      MULTIPLY(tmp4, FIX(0.221231742)),           /* c9 */
	      CONST_BITS-PASS1_BITS);
    tmp12 = MULTIPLY(tmp0 - tmp4, FIX(0.951056516)) -     /* (c3+c7)/2 */
	    MULTIPLY(tmp1 + tmp3, FIX(0.587785252));      /* (c1-c9)/2 */
    tmp13 = MULTIPLY(tmp10 + tmp11, FIX(0.309016994)) +   /* (c3-c7)/2 */
	    (tmp11 << (CONST_BITS - 1)) - tmp2;
    dataptr[3] = (DCTELEM) DESCALE(tmp12 + tmp13, CONST_BITS-PASS1_BITS);
    dataptr[7] = (DCTELEM) DESCALE(tmp12 - tmp13, CONST_BITS-PASS1_BITS);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   * We must also scale the output by (8/10)*(8/5) = 32/25, which we
   * fold into the constant multipliers:
   * 5-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/10) * 32/25.
   */

  dataptr = data;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*4];
    tmp1 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*3];
    tmp2 = dataptr[DCTSIZE*2];

    tmp10 = tmp0 + tmp1;
    tmp11 = tmp0 - tmp1;

    tmp0 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*4];
    tmp1 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*3];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 + tmp2, FIX(1.28)),        /* 32/25 */
	      CONST_BITS+PASS1_BITS);
    tmp11 = MULTIPLY(tmp11, FIX(1.011928851));          /* (c2+c4)/2 */
    tmp10 -= tmp2 << 2;
    tmp10 = MULTIPLY(tmp10, FIX(0.452548340));          /* (c2-c4)/2 */
    dataptr[DCTSIZE*2] = (DCTELEM) DESCALE(tmp11 + tmp10, CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*4] = (DCTELEM) DESCALE(tmp11 - tmp10, CONST_BITS+PASS1_BITS);

    /* Odd part */

    tmp10 = MULTIPLY(tmp0 + tmp1, FIX(1.064004961));    /* c3 */

    dataptr[DCTSIZE*1] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp0, FIX(0.657591230)), /* c1-c3 */
	      CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*3] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp1, FIX(2.785601151)), /* c1+c3 */
	      CONST_BITS+PASS1_BITS);

    dataptr++;			/* advance pointer to next column */
  }
}